

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O0

int Sfm_DecMffcArea(Abc_Ntk_t *pNtk,Vec_Int_t *vMffc)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  double dVar3;
  int local_28;
  int local_24;
  int nAreaMffc;
  int i;
  Abc_Obj_t *pObj;
  Vec_Int_t *vMffc_local;
  Abc_Ntk_t *pNtk_local;
  
  local_28 = 0;
  for (local_24 = 0; iVar1 = Vec_IntSize(vMffc), local_24 < iVar1; local_24 = local_24 + 1) {
    iVar1 = Vec_IntEntry(vMffc,local_24);
    pAVar2 = Abc_NtkObj(pNtk,iVar1);
    if (pAVar2 != (Abc_Obj_t *)0x0) {
      dVar3 = Mio_GateReadArea((Mio_Gate_t *)(pAVar2->field_5).pData);
      iVar1 = Scl_Flt2Int((float)dVar3);
      local_28 = iVar1 + local_28;
    }
  }
  return local_28;
}

Assistant:

int Sfm_DecMffcArea( Abc_Ntk_t * pNtk, Vec_Int_t * vMffc )
{
    Abc_Obj_t * pObj; 
    int i, nAreaMffc = 0;
    Abc_NtkForEachObjVec( vMffc, pNtk, pObj, i )
        nAreaMffc += Scl_Flt2Int(Mio_GateReadArea((Mio_Gate_t *)pObj->pData));
    return nAreaMffc;
}